

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# machine_implementation.cc
# Opt level: O1

void __thiscall testbench::anon_unknown_0::destroyer::~destroyer(destroyer *this)

{
  void *pvVar1;
  undefined8 *puVar2;
  
  puVar2 = (anonymous_namespace)::machines;
  if ((anonymous_namespace)::machines != (undefined8 *)0x0) {
    pvVar1 = (void *)(anonymous_namespace)::machines[3];
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,(anonymous_namespace)::machines[5] - (long)pvVar1);
    }
    pvVar1 = (void *)*puVar2;
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,puVar2[2] - (long)pvVar1);
    }
    operator_delete(puVar2,0x30);
    return;
  }
  return;
}

Assistant:

~destroyer()
    {
        if (machines != nullptr) {
            delete machines;
        }
    }